

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::~Array
          (Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *this)

{
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }